

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char ** parseUriList(char *text,int *count)

{
  char *__s2;
  int iVar1;
  char *__s1;
  size_t sVar2;
  long lVar3;
  int *in_RSI;
  char *in_RDI;
  char digits [3];
  char *path;
  char *line;
  char **paths;
  char *prefix;
  char local_33;
  char local_32;
  undefined1 local_31;
  char *local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  int *local_10;
  char *local_8;
  
  local_18 = "file://";
  local_20 = (char **)0x0;
  *in_RSI = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (__s1 = strtok(local_8,"\r\n"), __s2 = local_18, __s1 != (char *)0x0) {
    local_8 = (char *)0x0;
    local_28 = __s1;
    if (*__s1 != '#') {
      sVar2 = strlen(local_18);
      iVar1 = strncmp(__s1,__s2,sVar2);
      if (iVar1 == 0) {
        sVar2 = strlen(local_18);
        for (local_28 = local_28 + sVar2; *local_28 != '/'; local_28 = local_28 + 1) {
        }
      }
      *local_10 = *local_10 + 1;
      sVar2 = strlen(local_28);
      local_30 = (char *)calloc(sVar2 + 1,1);
      local_20 = (char **)realloc(local_20,(long)*local_10 << 3);
      local_20[*local_10 + -1] = local_30;
      for (; *local_28 != '\0'; local_28 = local_28 + 1) {
        if (((*local_28 == '%') && (local_28[1] != '\0')) && (local_28[2] != '\0')) {
          local_33 = local_28[1];
          local_32 = local_28[2];
          local_31 = 0;
          lVar3 = strtol(&local_33,(char **)0x0,0x10);
          *local_30 = (char)lVar3;
          local_28 = local_28 + 2;
        }
        else {
          *local_30 = *local_28;
        }
        local_30 = local_30 + 1;
      }
    }
  }
  return local_20;
}

Assistant:

static char** parseUriList(char* text, int* count)
{
    const char* prefix = "file://";
    char** paths = NULL;
    char* line;

    *count = 0;

    while ((line = strtok(text, "\r\n")))
    {
        text = NULL;

        if (line[0] == '#')
            continue;

        if (strncmp(line, prefix, strlen(prefix)) == 0)
        {
            line += strlen(prefix);
            // TODO: Validate hostname
            while (*line != '/')
                line++;
        }

        (*count)++;

        char* path = calloc(strlen(line) + 1, 1);
        paths = realloc(paths, *count * sizeof(char*));
        paths[*count - 1] = path;

        while (*line)
        {
            if (line[0] == '%' && line[1] && line[2])
            {
                const char digits[3] = { line[1], line[2], '\0' };
                *path = strtol(digits, NULL, 16);
                line += 2;
            }
            else
                *path = *line;

            path++;
            line++;
        }
    }

    return paths;
}